

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

bool __thiscall Node::removePredecessor(Node *this,Node *node)

{
  size_type sVar1;
  bool bVar2;
  Node *local_20;
  Node *local_18;
  
  if (node == (Node *)0x0) {
    bVar2 = false;
  }
  else {
    local_20 = node;
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    erase(&(this->predecessors_)._M_t,&local_20);
    local_18 = this;
    sVar1 = std::
            _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
            ::erase(&(local_20->successors_)._M_t,&local_18);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool Node::removePredecessor(Node *node) {
    if (!node) {
        return false;
    }
    predecessors_.erase(node);
    return node->successors_.erase(this);
}